

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

chibi * __thiscall chibi::base64_encode_abi_cxx11_(chibi *this,void *in_bytes,size_t numBytes)

{
  ulong uVar1;
  int local_8c;
  int local_88;
  int i_2;
  int i_1;
  int copyCount;
  size_t index;
  int i;
  size_t todo;
  uchar outbuf [4];
  ulong uStack_60;
  uchar inbuf [3];
  size_t baseIndex;
  size_t expectedResultSize;
  size_t expectedCharacterCount;
  size_t byteCount;
  uint8_t *bytes;
  size_t numBytes_local;
  void *in_bytes_local;
  string *result;
  
  std::__cxx11::string::string((string *)this);
  if (numBytes != 0) {
    std::__cxx11::string::reserve((ulong)this);
    for (uStack_60 = 0; uStack_60 < numBytes; uStack_60 = uStack_60 + 3) {
      for (index._4_4_ = 0; index._4_4_ < 3; index._4_4_ = index._4_4_ + 1) {
        if (uStack_60 + (long)index._4_4_ < numBytes) {
          *(undefined1 *)((long)&todo + (long)index._4_4_ + 5) =
               *(undefined1 *)((long)in_bytes + uStack_60 + (long)index._4_4_);
        }
        else {
          *(undefined1 *)((long)&todo + (long)index._4_4_ + 5) = 0;
        }
      }
      todo._1_1_ = todo._5_1_ >> 2;
      todo._2_1_ = (todo._5_1_ & 3) << 4 | todo._6_1_ >> 4;
      todo._3_1_ = (todo._7_1_ >> 6) + (todo._6_1_ & 0xf) * '\x04';
      todo._4_1_ = todo._7_1_ & 0x3f;
      i_2 = 4;
      if (numBytes - uStack_60 == 1) {
        i_2 = 2;
      }
      else if (numBytes - uStack_60 == 2) {
        i_2 = 3;
      }
      for (local_88 = 0; local_88 < i_2; local_88 = local_88 + 1) {
        std::__cxx11::string::push_back((char)this);
      }
      for (local_8c = i_2; local_8c < 4; local_8c = local_8c + 1) {
        std::__cxx11::string::push_back((char)this);
      }
    }
    uVar1 = std::__cxx11::string::size();
    if (uVar1 != ((numBytes * 8 + 5) / 6 + 3 & 0xfffffffffffffffc)) {
      __assert_fail("result.size() == expectedResultSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marcel303[P]chibi/base64.cpp"
                    ,0x4d,"std::string chibi::base64_encode(const void *, const size_t)");
    }
  }
  return this;
}

Assistant:

std::string base64_encode(const void * in_bytes, const size_t numBytes)
	{
		std::string result;
		
		if (numBytes == 0)
			return result;

		const uint8_t * bytes = (const uint8_t*)in_bytes;
		const size_t byteCount = numBytes;
		
		const size_t expectedCharacterCount = (byteCount * 8 + 5) / 6;
		const size_t expectedResultSize = (expectedCharacterCount + 3) / 4 * 4;
		result.reserve(expectedResultSize);
		
		size_t baseIndex = 0;
		
		unsigned char inbuf[3];
		unsigned char outbuf[4];
		
		for (;;)
		{
			if (baseIndex >= byteCount)
				break;

			const size_t todo = byteCount - baseIndex;
			
			for (int i = 0; i < 3; i++)
			{
				const size_t index = baseIndex + i;
				
				if (index < byteCount)
					inbuf[i] = bytes[index];
				else
					inbuf[i] = 0;
			}
			
			outbuf[0] = (inbuf [0] & 0xFC) >> 2;
			outbuf[1] = ((inbuf [0] & 0x03) << 4) | ((inbuf [1] & 0xF0) >> 4);
			outbuf[2] = ((inbuf [1] & 0x0F) << 2) | ((inbuf [2] & 0xC0) >> 6);
			outbuf[3] = inbuf [2] & 0x3F;
			
			int copyCount = 4;
			
			switch (todo)
			{
				case 1: 
					copyCount = 2; 
					break;
				case 2: 
					copyCount = 3; 
					break;
			}
			
			for (int i = 0; i < copyCount; i++)
				result.push_back(encodingTable[outbuf[i]]);
			
			for (int i = copyCount; i < 4; i++)
				result.push_back('=');
			
			baseIndex += 3;
		}
		
		assert(result.size() == expectedResultSize); // if unequal, we either reserved too much memory, or had to grow/realloc the resulting array
		
		return result;
	}